

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool cmQtAutoGenerator::MakeParentDirectory(string *filename)

{
  undefined1 uVar1;
  ulong uVar2;
  Status local_40;
  undefined1 local_38 [8];
  string dirName;
  bool success;
  string *filename_local;
  
  dirName.field_2._M_local_buf[0xf] = '\x01';
  cmsys::SystemTools::GetFilenamePath((string *)local_38,filename);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_40 = cmsys::SystemTools::MakeDirectory((string *)local_38,(mode_t *)0x0);
    dirName.field_2._M_local_buf[0xf] = cmsys::Status::operator_cast_to_bool(&local_40);
  }
  uVar1 = dirName.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)local_38);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmQtAutoGenerator::MakeParentDirectory(std::string const& filename)
{
  bool success = true;
  std::string const dirName = cmSystemTools::GetFilenamePath(filename);
  if (!dirName.empty()) {
    success = static_cast<bool>(cmSystemTools::MakeDirectory(dirName));
  }
  return success;
}